

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# issue.cpp
# Opt level: O1

void __thiscall libcellml::Issue::~Issue(Issue *this)

{
  ~Issue(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

Issue::~Issue()
{
    delete mPimpl;
}